

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O2

void Sbd_ProblemPrintSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  int iVar1;
  int Lit;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int i;
  long lVar5;
  Sbd_Str_t *pSVar6;
  bool bVar7;
  
  puts("Solution found:");
  i = 0;
  for (pSVar6 = pStr0; pSVar6 < pStr0 + nStrs; pSVar6 = pSVar6 + 1) {
    pcVar4 = "LUT";
    iVar3 = 1 << ((byte)pSVar6->nVarIns & 0x1f);
    if (pSVar6->fLut == 0) {
      pcVar4 = "SEL";
      iVar3 = pSVar6->nVarIns;
    }
    printf("%s%d : ",pcVar4,((long)pSVar6 - (long)pStr0) / 0x38 & 0xffffffff);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar1 = i + iVar3;
    while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      Lit = Vec_IntEntry(vLits,i);
      uVar2 = Abc_LitIsCompl(Lit);
      printf("%d",(ulong)(uVar2 ^ 1));
      i = i + 1;
    }
    printf("    {");
    for (lVar5 = 0; lVar5 < pSVar6->nVarIns; lVar5 = lVar5 + 1) {
      printf(" %d",(ulong)(uint)pSVar6->VarIns[lVar5]);
    }
    puts(" }");
    i = iVar1;
  }
  if (i != vLits->nSize) {
    __assert_fail("iLit == Vec_IntSize(vLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                  ,0x90,"void Sbd_ProblemPrintSolution(int, Sbd_Str_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

void Sbd_ProblemPrintSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    printf( "Solution found:\n" );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        nIters = pStr->fLut ? 1 << pStr->nVarIns : pStr->nVarIns;
        printf( "%s%d : ", pStr->fLut ? "LUT":"SEL", (int)(pStr-pStr0) );
        for ( m = 0; m < nIters; m++, iLit++ )
            printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) );
        printf( "    {" );
        for ( m = 0; m < pStr->nVarIns; m++ )
            printf( " %d", pStr->VarIns[m] );
        printf( " }\n" );
    }
    assert( iLit == Vec_IntSize(vLits) );
}